

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_split_edg(REF_SUBDIV ref_subdiv)

{
  uint uVar1;
  REF_STATUS RVar2;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_INT edge01;
  REF_INT *marked_for_removal;
  REF_INT local_118;
  REF_INT new_cell;
  REF_INT new_nodes [27];
  REF_INT local_a4;
  REF_INT nodes [27];
  REF_CELL local_30;
  REF_CELL edg_split;
  REF_CELL edg;
  REF_SUBDIV pRStack_18;
  REF_INT cell;
  REF_SUBDIV ref_subdiv_local;
  
  edg_split = ref_subdiv->grid->cell[0];
  pRStack_18 = ref_subdiv;
  if (edg_split->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x553,
           "ref_subdiv_split_edg","malloc marked_for_removal of REF_INT negative");
    ref_subdiv_local._4_4_ = 1;
  }
  else {
    _ref_malloc_init_i = malloc((long)edg_split->max << 2);
    if (_ref_malloc_init_i == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x553,"ref_subdiv_split_edg","malloc marked_for_removal of REF_INT NULL");
      ref_subdiv_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < edg_split->max;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        *(undefined4 *)((long)_ref_malloc_init_i + (long)ref_private_macro_code_rss_1 * 4) = 0;
      }
      uVar1 = ref_cell_create(&local_30,edg_split->type);
      if (uVar1 == 0) {
        for (edg._4_4_ = 0; edg._4_4_ < edg_split->max; edg._4_4_ = edg._4_4_ + 1) {
          if (((-1 < edg._4_4_) && (edg._4_4_ < edg_split->max)) &&
             (edg_split->c2n[edg_split->size_per * edg._4_4_] != -1)) {
            uVar1 = ref_cell_nodes(edg_split,edg._4_4_,new_nodes + 0x1a);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x558,"ref_subdiv_split_edg",(ulong)uVar1,"nodes");
              return uVar1;
            }
            uVar1 = ref_edge_with(pRStack_18->edge,new_nodes[0x1a],local_a4,
                                  &ref_private_macro_code_rss);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x55a,"ref_subdiv_split_edg",(ulong)uVar1,"e01");
              return uVar1;
            }
            if (pRStack_18->mark[ref_private_macro_code_rss] != 0) {
              *(undefined4 *)((long)_ref_malloc_init_i + (long)edg._4_4_ * 4) = 1;
              uVar1 = ref_cell_nodes(edg_split,edg._4_4_,&local_118);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x55e,"ref_subdiv_split_edg",(ulong)uVar1,"nodes");
                return uVar1;
              }
              uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],local_a4,&local_118);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x561,"ref_subdiv_split_edg",(ulong)uVar1,"mis");
                return uVar1;
              }
              uVar1 = ref_cell_add(local_30,&local_118,(REF_INT *)((long)&marked_for_removal + 4));
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x562,"ref_subdiv_split_edg",(ulong)uVar1,"add");
                return uVar1;
              }
              uVar1 = ref_cell_nodes(edg_split,edg._4_4_,&local_118);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x563,"ref_subdiv_split_edg",(ulong)uVar1,"nodes");
                return uVar1;
              }
              uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],local_a4,&new_cell);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x566,"ref_subdiv_split_edg",(ulong)uVar1,"mis");
                return uVar1;
              }
              uVar1 = ref_cell_add(local_30,&local_118,(REF_INT *)((long)&marked_for_removal + 4));
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x567,"ref_subdiv_split_edg",(ulong)uVar1,"add");
                return uVar1;
              }
            }
          }
        }
        for (edg._4_4_ = 0; edg._4_4_ < edg_split->max; edg._4_4_ = edg._4_4_ + 1) {
          if ((*(int *)((long)_ref_malloc_init_i + (long)edg._4_4_ * 4) == 1) &&
             (uVar1 = ref_cell_remove(edg_split,edg._4_4_), uVar1 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x56d,"ref_subdiv_split_edg",(ulong)uVar1,"remove");
            return uVar1;
          }
        }
        for (edg._4_4_ = 0; edg._4_4_ < local_30->max; edg._4_4_ = edg._4_4_ + 1) {
          RVar2 = ref_cell_nodes(local_30,edg._4_4_,new_nodes + 0x1a);
          if ((RVar2 == 0) &&
             (uVar1 = ref_subdiv_add_local_cell(pRStack_18,edg_split,new_nodes + 0x1a), uVar1 != 0))
          {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x570,"ref_subdiv_split_edg",(ulong)uVar1,"add local");
            return uVar1;
          }
        }
        uVar1 = ref_cell_free(local_30);
        if (uVar1 == 0) {
          free(_ref_malloc_init_i);
          ref_subdiv_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x572,"ref_subdiv_split_edg",(ulong)uVar1,"temp edg free");
          ref_subdiv_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x555,"ref_subdiv_split_edg",(ulong)uVar1,"temp edg");
        ref_subdiv_local._4_4_ = uVar1;
      }
    }
  }
  return ref_subdiv_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_split_edg(REF_SUBDIV ref_subdiv) {
  REF_INT cell;
  REF_CELL edg;
  REF_CELL edg_split;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  REF_INT *marked_for_removal;

  REF_INT edge01;

  edg = ref_grid_edg(ref_subdiv_grid(ref_subdiv));

  ref_malloc_init(marked_for_removal, ref_cell_max(edg), REF_INT, 0);

  RSS(ref_cell_create(&edg_split, ref_cell_type(edg)), "temp edg");

  each_ref_cell_valid_cell(edg, cell) {
    RSS(ref_cell_nodes(edg, cell, nodes), "nodes");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[0], nodes[1], &edge01),
        "e01");

    if (ref_subdiv_mark(ref_subdiv, edge01)) {
      marked_for_removal[cell] = 1;
      RSS(ref_cell_nodes(edg, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_cell_add(edg_split, new_nodes, &new_cell), "add");
      RSS(ref_cell_nodes(edg, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_cell_add(edg_split, new_nodes, &new_cell), "add");
    }
  }

  for (cell = 0; cell < ref_cell_max(edg); cell++)
    if (1 == marked_for_removal[cell])
      RSS(ref_cell_remove(edg, cell), "remove");

  each_ref_cell_valid_cell_with_nodes(edg_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, edg, nodes), "add local");

  RSS(ref_cell_free(edg_split), "temp edg free");

  free(marked_for_removal);

  return REF_SUCCESS;
}